

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

int __thiscall jpgd::jpeg_decoder::init_scan(jpeg_decoder *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = locate_sos_marker(this);
  iVar3 = 0;
  if (iVar2 != 0) {
    bVar1 = calc_mcu_block_order(this);
    iVar3 = 0;
    if (bVar1) {
      check_huff_tables(this);
      check_quant_tables(this);
      memset(this->m_last_dc_val,0,(long)this->m_comps_in_frame << 2);
      this->m_eob_run = 0;
      if (this->m_restart_interval != 0) {
        this->m_restarts_left = this->m_restart_interval;
        this->m_next_restart_num = 0;
      }
      fix_in_buffer(this);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int jpeg_decoder::init_scan()
	{
		if (!locate_sos_marker())
			return JPGD_FALSE;

		if (!calc_mcu_block_order())
			return JPGD_FALSE;

		check_huff_tables();

		check_quant_tables();

		memset(m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

		m_eob_run = 0;

		if (m_restart_interval)
		{
			m_restarts_left = m_restart_interval;
			m_next_restart_num = 0;
		}

		fix_in_buffer();

		return JPGD_TRUE;
	}